

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdebug.h
# Opt level: O1

QDebug __thiscall
QtPrivate::printSequentialContainer<QList<QByteArray>>
          (QtPrivate *this,QDebug debug,char *which,QList<QByteArray> *c)

{
  QTextStream *pQVar1;
  QByteArray *pQVar2;
  long lVar3;
  _func_int **pp_Var4;
  QString *pQVar5;
  QList<QByteArray> *pQVar6;
  QByteArray *pQVar7;
  QString *this_00;
  char *pcVar8;
  long in_FS_OFFSET;
  QByteArrayView ba;
  QByteArrayView ba_00;
  QDebugStateSaver saver;
  QDebugStateSaver local_58;
  QString local_50;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_58.d._M_t.
  super___uniq_ptr_impl<QDebugStateSaverPrivate,_std::default_delete<QDebugStateSaverPrivate>_>._M_t
  .super__Tuple_impl<0UL,_QDebugStateSaverPrivate_*,_std::default_delete<QDebugStateSaverPrivate>_>.
  super__Head_base<0UL,_QDebugStateSaverPrivate_*,_false>._M_head_impl =
       (unique_ptr<QDebugStateSaverPrivate,_std::default_delete<QDebugStateSaverPrivate>_>)
       &DAT_aaaaaaaaaaaaaaaa;
  pQVar6 = c;
  QDebugStateSaver::QDebugStateSaver(&local_58,(QDebug *)debug.stream);
  pQVar1 = (QTextStream *)((debug.stream)->ts)._vptr_QTextStream;
  *(undefined1 *)&pQVar1[3]._vptr_QTextStream = 0;
  if (which == (char *)0x0) {
    this_00 = (QString *)0x0;
  }
  else {
    pQVar5 = (QString *)0xffffffffffffffff;
    do {
      this_00 = (QString *)((long)&(pQVar5->d).d + 1);
      pcVar8 = which + 1 + (long)pQVar5;
      pQVar5 = this_00;
    } while (*pcVar8 != '\0');
  }
  ba.m_data = (storage_type *)pQVar6;
  ba.m_size = (qsizetype)which;
  QString::fromUtf8(&local_50,this_00,ba);
  ::QTextStream::operator<<(pQVar1,&local_50);
  if (&(local_50.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_50.d.d)->super_QArrayData,2,0x10);
    }
  }
  pQVar1 = (QTextStream *)((debug.stream)->ts)._vptr_QTextStream;
  if (*(char *)&pQVar1[3]._vptr_QTextStream == '\x01') {
    ::QTextStream::operator<<(pQVar1,' ');
  }
  ::QTextStream::operator<<((QTextStream *)((debug.stream)->ts)._vptr_QTextStream,'(');
  pQVar1 = (QTextStream *)((debug.stream)->ts)._vptr_QTextStream;
  if (*(char *)&pQVar1[3]._vptr_QTextStream == '\x01') {
    ::QTextStream::operator<<(pQVar1,' ');
  }
  pQVar2 = (c->d).ptr;
  lVar3 = (c->d).size;
  pQVar7 = pQVar2;
  if (lVar3 != 0) {
    pcVar8 = (pQVar2->d).ptr;
    if (pcVar8 == (char *)0x0) {
      pcVar8 = "";
    }
    pQVar6 = (QList<QByteArray> *)0x0;
    QDebug::putByteArray((QDebug *)debug.stream,pcVar8,(pQVar2->d).size,ContainsBinary);
    pQVar1 = (QTextStream *)((debug.stream)->ts)._vptr_QTextStream;
    if (*(char *)&pQVar1[3]._vptr_QTextStream == '\x01') {
      ::QTextStream::operator<<(pQVar1,' ');
    }
    pQVar7 = pQVar2 + 1;
  }
  if (pQVar7 != pQVar2 + lVar3) {
    do {
      pQVar1 = (QTextStream *)((debug.stream)->ts)._vptr_QTextStream;
      ba_00.m_data = (storage_type *)pQVar6;
      ba_00.m_size = (qsizetype)", ";
      QString::fromUtf8(&local_50,(QString *)0x2,ba_00);
      ::QTextStream::operator<<(pQVar1,&local_50);
      if (&(local_50.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_50.d.d)->super_QArrayData,2,0x10);
        }
      }
      pQVar1 = (QTextStream *)((debug.stream)->ts)._vptr_QTextStream;
      if (*(char *)&pQVar1[3]._vptr_QTextStream == '\x01') {
        ::QTextStream::operator<<(pQVar1,' ');
      }
      pcVar8 = (pQVar7->d).ptr;
      if (pcVar8 == (char *)0x0) {
        pcVar8 = "";
      }
      pQVar6 = (QList<QByteArray> *)0x0;
      QDebug::putByteArray((QDebug *)debug.stream,pcVar8,(pQVar7->d).size,ContainsBinary);
      pQVar1 = (QTextStream *)((debug.stream)->ts)._vptr_QTextStream;
      if (*(char *)&pQVar1[3]._vptr_QTextStream == '\x01') {
        ::QTextStream::operator<<(pQVar1,' ');
      }
      pQVar7 = pQVar7 + 1;
    } while (pQVar7 != pQVar2 + lVar3);
  }
  ::QTextStream::operator<<((QTextStream *)((debug.stream)->ts)._vptr_QTextStream,')');
  pQVar1 = (QTextStream *)((debug.stream)->ts)._vptr_QTextStream;
  if (*(char *)&pQVar1[3]._vptr_QTextStream == '\x01') {
    ::QTextStream::operator<<(pQVar1,' ');
  }
  pp_Var4 = ((debug.stream)->ts)._vptr_QTextStream;
  ((debug.stream)->ts)._vptr_QTextStream = (_func_int **)0x0;
  *(_func_int ***)this = pp_Var4;
  QDebugStateSaver::~QDebugStateSaver(&local_58);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return (QDebug)(Stream *)this;
}

Assistant:

inline QDebug printSequentialContainer(QDebug debug, const char *which, const SequentialContainer &c)
{
    const QDebugStateSaver saver(debug);
    debug.nospace() << which << '(';
    typename SequentialContainer::const_iterator it = c.begin(), end = c.end();
    if (it != end) {
        debug << *it;
        ++it;
    }
    while (it != end) {
        debug << ", " << *it;
        ++it;
    }
    debug << ')';
    return debug;
}